

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdGetPsbtData(void *handle,void *psbt_handle,char **psbt_base64,char **psbt_hex)

{
  char *pcVar1;
  char *pcVar2;
  CfdException *this;
  undefined1 local_78 [32];
  char *work_base64;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  undefined8 local_38;
  
  work_base64 = (char *)0x0;
  local_38 = 0;
  cfd::Initialize();
  std::__cxx11::string::string((string *)local_78,"PsbtHandle",(allocator *)&local_50);
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  if (*(Psbt **)((long)psbt_handle + 0x18) != (Psbt *)0x0) {
    if (psbt_base64 == (char **)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      cfd::core::Psbt::GetBase64_abi_cxx11_((string *)local_78,*(Psbt **)((long)psbt_handle + 0x18))
      ;
      pcVar1 = cfd::capi::CreateString((string *)local_78);
      work_base64 = pcVar1;
      std::__cxx11::string::~string((string *)local_78);
    }
    if (psbt_hex == (char **)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      cfd::core::Psbt::GetData((ByteData *)&local_50,*(Psbt **)((long)psbt_handle + 0x18));
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_78,(ByteData *)&local_50);
      pcVar2 = cfd::capi::CreateString((string *)local_78);
      std::__cxx11::string::~string((string *)local_78);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
    }
    if (psbt_base64 != (char **)0x0) {
      *psbt_base64 = pcVar1;
    }
    if (psbt_hex != (char **)0x0) {
      *psbt_hex = pcVar2;
    }
    return 0;
  }
  local_78._0_8_ = "cfdcapi_psbt.cpp";
  local_78._8_4_ = 0x161;
  local_78._16_8_ = "CfdGetPsbtData";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_78,"psbt is null.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_78,"Failed to handle statement. psbt is null.",(allocator *)&local_50);
  cfd::core::CfdException::CfdException(this,kCfdIllegalStateError,(string *)local_78);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPsbtData(
    void* handle, void* psbt_handle, char** psbt_base64, char** psbt_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_base64 = nullptr;
  char* work_hex = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    if (psbt_base64 != nullptr) {
      work_base64 = CreateString(psbt_obj->psbt->GetBase64());
    }
    if (psbt_hex != nullptr) {
      work_hex = CreateString(psbt_obj->psbt->GetData().GetHex());
    }
    if (psbt_base64 != nullptr) *psbt_base64 = work_base64;
    if (psbt_hex != nullptr) *psbt_hex = work_hex;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_base64, &work_hex);
  return result;
}